

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::NegativeTests::iterate(NegativeTests *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar9;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  GLint page_size;
  int local_1ac;
  undefined1 local_1a8 [16];
  TestLog local_198 [13];
  ios_base local_130 [264];
  long lVar8;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  local_1ac = 0;
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_buffer");
  if (!bVar2) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"GL_ARB_sparse_buffer is not supported","");
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1a8);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar8 + 0x868))(0x82f8,&local_1ac);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1bf);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_helper_bo_id);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_immutable_bo_id);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_sparse_bo_id);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glGenBuffers() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1c4);
  (**(code **)(lVar8 + 0x40))(0x8892,this->m_sparse_bo_id);
  (**(code **)(lVar8 + 0x40))(0x8f36,this->m_immutable_bo_id);
  (**(code **)(lVar8 + 0x40))(0x8893,this->m_helper_bo_id);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1c9);
  (**(code **)(lVar8 + 0x160))(0x8892,(long)(local_1ac * 3),0,0x400);
  (**(code **)(lVar8 + 0x160))(0x8f36,this->m_immutable_bo_size,0,0);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glBufferStorage() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1d1);
  (**(code **)(lVar8 + 0x158))(0x8c8c,0,(long)local_1ac,1);
  iVar3 = (**(code **)(lVar8 + 0x800))();
  if (iVar3 != 0x500) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid <target> value passed to a glBufferPageCommitmentARB() call did not generate a GL_INVALID_ENUM error."
               ,0x6d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
  }
  (**(code **)(lVar8 + 0x160))(0x8893,(long)(local_1ac * 3),0,0x401);
  iVar5 = (**(code **)(lVar8 + 0x800))();
  if (iVar5 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid <flags> value set to GL_SPARSE_STORAGE_BIT_ARB | GL_MAP_READ_BIT did not generate a GL_INVALID_VALUE error."
               ,0x73);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
  }
  (**(code **)(lVar8 + 0x160))(0x8893,(long)(local_1ac * 3),0,0x402);
  iVar6 = (**(code **)(lVar8 + 0x800))();
  if (iVar6 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid <flags> value set to GL_SPARSE_STORAGE_BIT_ARB | GL_MAP_WRITE_BIT did not generate a GL_INVALID_VALUE error."
               ,0x74);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
  }
  (**(code **)(lVar8 + 0x158))(0x8f36,0,(long)local_1ac,1);
  iVar7 = (**(code **)(lVar8 + 0x800))();
  if (iVar7 != 0x502) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid error code generated by glBufferPageCommitmentARB()  issued against an immutable, non-sparse buffer object."
               ,0x73);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
  }
  bVar2 = iVar7 == 0x502 && (iVar6 == 0x501 && (iVar5 == 0x501 && iVar3 == 0x500));
  if ((long)local_1ac != 1) {
    (**(code **)(lVar8 + 0x158))(0x8892,(long)(local_1ac / 2),(long)local_1ac,1);
    iVar3 = (**(code **)(lVar8 + 0x800))();
    if (iVar3 != 0x501) {
      local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Invalid error code generated by glBufferPageCommitmentARB() whose <offset> value was set to (page size / 2)."
                 ,0x6c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_130);
    }
    bVar2 = iVar3 == 0x501 && bVar2;
    if (local_1ac != 1) {
      (**(code **)(lVar8 + 0x158))(0x8892,0,(long)(local_1ac / 2),1);
      iVar3 = (**(code **)(lVar8 + 0x800))();
      if (iVar3 != 0x501) {
        local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Invalid error code generated by glBufferPageCommitmentARB() whose <size> value was set to (page size / 2)."
                   ,0x6a);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_130);
        bVar2 = false;
      }
    }
  }
  (**(code **)(lVar8 + 0x158))(0x8892,0xffffffffffffffff,(long)local_1ac,1);
  iVar3 = (**(code **)(lVar8 + 0x800))();
  if (iVar3 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid error code generated by glBufferPageCommitmentARB() whose <offset> argument was set to -1."
               ,0x62);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  (**(code **)(lVar8 + 0x158))(0x8892,0,0xffffffffffffffff,1);
  iVar3 = (**(code **)(lVar8 + 0x800))();
  if (iVar3 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid error code generated by glBufferPageCommitmentARB() whose <size> argument was set to -1."
               ,0x60);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  (**(code **)(lVar8 + 0x158))(0x8892,0,(long)(local_1ac << 2),1);
  iVar3 = (**(code **)(lVar8 + 0x800))();
  if (iVar3 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid error code generated by glBufferPageCommitmentARB() whose <offset> was set to 0 and <size> was set to (page size * 4), when the buffer storage size had been configured to be (page size * 3)."
               ,0xc6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  (**(code **)(lVar8 + 0x158))(0x8892,(long)local_1ac,(long)(local_1ac * 3),1);
  iVar3 = (**(code **)(lVar8 + 0x800))();
  if (iVar3 != 0x501) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid error code generated by glBufferPageCommitmentARB() whose <offset> was set to (page size) and <size> was set to (page size * 3), when the buffer storage size had been configured to be (page size * 3)."
               ,0xd0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  lVar9 = (**(code **)(lVar8 + 0xcf8))(0x8892,35000);
  if (lVar9 != 0) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Non-NULL pointer returned by an invalid glMapBuffer() call, issued against a sparse buffer object"
               ,0x61);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  iVar3 = (**(code **)(lVar8 + 0x800))();
  if (iVar3 != 0x502) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid error code generated by glMapBuffer() call, issued against a sparse buffer object"
               ,0x59);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  lVar9 = (**(code **)(lVar8 + 0xd00))(0x8892,0,(long)local_1ac,1);
  if (lVar9 != 0) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Non-NULL pointer returned by an invalid glMapBufferRange() call, issued against a sparse buffer object"
               ,0x66);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  iVar3 = (**(code **)(lVar8 + 0x800))();
  if (iVar3 == 0x502) {
    testResult = (qpTestResult)(byte)~bVar2;
    description = "Fail";
    if (bVar2) {
      description = "Pass";
    }
  }
  else {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid error code generated by glMapBufferRange() call, issued against a sparse buffer object"
               ,0x5e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult NegativeTests::iterate()
{
	glw::GLvoid*		  data_ptr  = DE_NULL;
	const glw::Functions& gl		= m_context.getRenderContext().getFunctions();
	glw::GLint			  page_size = 0;
	bool				  result	= true;

	/* Only execute if the implementation supports the GL_ARB_sparse_buffer extension */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer"))
	{
		throw tcu::NotSupportedError("GL_ARB_sparse_buffer is not supported");
	}

	/* Set up */
	gl.getIntegerv(GL_SPARSE_BUFFER_PAGE_SIZE_ARB, &page_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");

	gl.genBuffers(1, &m_helper_bo_id);
	gl.genBuffers(1, &m_immutable_bo_id);
	gl.genBuffers(1, &m_sparse_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call(s) failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo_id);
	gl.bindBuffer(GL_COPY_READ_BUFFER, m_immutable_bo_id);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_helper_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferStorage(GL_ARRAY_BUFFER, page_size * 3, /* size as per test spec */
					 DE_NULL,						 /* data */
					 GL_SPARSE_STORAGE_BIT_ARB);
	gl.bufferStorage(GL_COPY_READ_BUFFER, m_immutable_bo_size, /* size */
					 DE_NULL,								   /* data */
					 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferStorage() call(s) failed.");

	/** * Verify glBufferPageCommitmentARB() returns GL_INVALID_ENUM if <target> is
	 *    set to GL_INTERLEAVED_ATTRIBS. */
	glw::GLint error_code = GL_NO_ERROR;

	gl.bufferPageCommitmentARB(GL_INTERLEAVED_ATTRIBS, 0, /* offset */
							   page_size, GL_TRUE);		  /* commit */

	error_code = gl.getError();
	if (error_code != GL_INVALID_ENUM)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid <target> value passed to a glBufferPageCommitmentARB() call"
							  " did not generate a GL_INVALID_ENUM error."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/*  * Verify glBufferStorage() throws a GL_INVALID_VALUE error if <flags> is
	 *    set to (GL_SPARSE_STORAGE_BIT_ARB | GL_MAP_READ_BIT) or
	 *    (GL_SPARSE_STORAGE_BIT_ARB | GL_MAP_WRITE_BIT). */
	gl.bufferStorage(GL_ELEMENT_ARRAY_BUFFER, page_size * 3, /* size */
					 DE_NULL,								 /* data */
					 GL_SPARSE_STORAGE_BIT_ARB | GL_MAP_READ_BIT);

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid <flags> value set to GL_SPARSE_STORAGE_BIT_ARB | GL_MAP_READ_BIT "
							  "did not generate a GL_INVALID_VALUE error."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	gl.bufferStorage(GL_ELEMENT_ARRAY_BUFFER, page_size * 3, /* size */
					 DE_NULL,								 /* data */
					 GL_SPARSE_STORAGE_BIT_ARB | GL_MAP_WRITE_BIT);

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid <flags> value set to GL_SPARSE_STORAGE_BIT_ARB | GL_MAP_WRITE_BIT "
							  "did not generate a GL_INVALID_VALUE error."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/*  * Verify glBufferPageCommitmentARB() generates a GL_INVALID_OPERATION error if
	 *    it is called for an immutable BO, which has not been initialized with the
	 *    GL_SPARSE_STORAGE_BIT_ARB flag. */
	gl.bufferPageCommitmentARB(GL_COPY_READ_BUFFER, 0, /* offset */
							   page_size, GL_TRUE);	/* commit */

	error_code = gl.getError();
	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid error code generated by glBufferPageCommitmentARB() "
													   " issued against an immutable, non-sparse buffer object."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/*  * Verify glBufferPageCommitmentARB() issues a GL_INVALID_VALUE error if <offset>
	 *    is set to (0.5 * GL_SPARSE_BUFFER_PAGE_SIZE_ARB). Skip if the constant's value
	 *    is equal to 1. */
	if (page_size != 1)
	{
		gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, page_size / 2, /* offset */
								   page_size, GL_TRUE);			   /* commit */

		error_code = gl.getError();
		if (error_code != GL_INVALID_VALUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid error code generated by glBufferPageCommitmentARB() "
								  "whose <offset> value was set to (page size / 2)."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* if (page_size != 1) */

	/*  * Verify glBufferPageCommitmentARB() emits a GL_INVALID_VALUE error if <size>
	 *    is set to (0.5 * GL_SPARSE_BUFFER_PAGE_SIZE_ARB). Skip if the constant's value
	 *    is equal to 1. */
	if (page_size != 1)
	{
		gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0,		/* offset */
								   page_size / 2, GL_TRUE); /* commit */

		error_code = gl.getError();
		if (error_code != GL_INVALID_VALUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Invalid error code generated by glBufferPageCommitmentARB() "
								  "whose <size> value was set to (page size / 2)."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* if (page_size != 1) */

	/*  * Verify glBufferPageCommitmentARB() returns GL_INVALID_VALUE if <offset> is
	 *    set to -1, but all other arguments are valid. */
	gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, -1, /* offset */
							   page_size, GL_TRUE); /* commit */

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid error code generated by glBufferPageCommitmentARB() "
													   "whose <offset> argument was set to -1."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/*  * Verify glBufferPageCommitmentARB() returns GL_INVALID_VALUE if <size> is
	 *    set to -1, but all other arguments are valid. */
	gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0, /* offset */
							   -1,				   /* size */
							   GL_TRUE);		   /* commit */

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid error code generated by glBufferPageCommitmentARB() "
													   "whose <size> argument was set to -1."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/*  * Verify glBufferPageCommitmentARB() returns GL_INVALID_VALUE if BO's size is
	 *    GL_SPARSE_BUFFER_PAGE_SIZE_ARB * 3, but the <offset> is set to 0 and <size>
	 *    argument used for the call is set to GL_SPARSE_BUFFER_PAGE_SIZE_ARB * 4. */
	gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0, /* offset */
							   page_size * 4,	  /* size */
							   GL_TRUE);

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid error code generated by glBufferPageCommitmentARB() "
							  "whose <offset> was set to 0 and <size> was set to (page size * 4), "
							  "when the buffer storage size had been configured to be (page size * 3)."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/*  * Verify glBufferPageCommitmentARB() returns GL_INVALID_VALUE if BO's size is
	 *    GL_SPARSE_BUFFER_PAGE_SIZE_ARB * 3, but the <offset> is set to
	 *    GL_SPARSE_BUFFER_PAGE_SIZE_ARB * 1 and <size> argument used for the call
	 *    is set to GL_SPARSE_BUFFER_PAGE_SIZE_ARB * 3. */
	gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, page_size * 1, /* offset */
							   page_size * 3,				   /* size */
							   GL_TRUE);

	error_code = gl.getError();
	if (error_code != GL_INVALID_VALUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid error code generated by glBufferPageCommitmentARB() "
							  "whose <offset> was set to (page size) and <size> was set to (page size * 3), "
							  "when the buffer storage size had been configured to be (page size * 3)."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	/*  * Verify that calling glMapBuffer() or glMapBufferRange() against a sparse
	 *    buffer generates a GL_INVALID_OPERATION error. */
	data_ptr = gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_ONLY);

	if (data_ptr != DE_NULL)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Non-NULL pointer returned by an invalid glMapBuffer() call, issued "
							  "against a sparse buffer object"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	error_code = gl.getError();

	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid error code generated by glMapBuffer() call, issued against "
							  "a sparse buffer object"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	data_ptr = gl.mapBufferRange(GL_ARRAY_BUFFER, 0, /* offset */
								 page_size,			 /* length */
								 GL_MAP_READ_BIT);

	if (data_ptr != DE_NULL)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Non-NULL pointer returned by an invalid glMapBufferRange() call, issued "
							  "against a sparse buffer object"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	error_code = gl.getError();

	if (error_code != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid error code generated by glMapBufferRange() call, issued against "
							  "a sparse buffer object"
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}